

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  mz_uint16 method;
  mz_uint16 mVar1;
  size_t sVar2;
  undefined1 uVar3;
  mz_bool mVar4;
  mz_uint mVar5;
  int iVar6;
  tdefl_status tVar7;
  FILE *__stream;
  tdefl_compressor *ptVar8;
  size_t sVar9;
  mz_uint8 *pmVar10;
  tdefl_compressor *ptVar11;
  undefined8 uVar12;
  tdefl_compressor *ptVar13;
  long lVar14;
  void *pvVar15;
  uint uVar16;
  mz_uint64 mVar17;
  bool bVar18;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_fffffffffffffed8;
  mz_uint32 in_stack_fffffffffffffee0;
  ulong local_118;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  tdefl_compressor *local_100;
  tdefl_compressor *local_f8;
  mz_uint8 *local_f0;
  size_t local_e8;
  ulong local_e0;
  ulong local_d8;
  void *local_d0;
  mz_zip_writer_add_state state;
  time_t local_70;
  
  dos_time = 0;
  dos_date = 0;
  uVar16 = 6;
  if (-1 < (int)level_and_flags) {
    uVar16 = level_and_flags;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (10 < (uVar16 & 0xf) || pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if ((uVar16 >> 10 & 1) != 0) {
    return 0;
  }
  mVar17 = pZip->m_archive_size;
  local_d0 = pComment;
  mVar4 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar4 == 0) {
    return 0;
  }
  local_e8 = strlen(pArchive_name);
  if (0xffff < local_e8) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar5 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  local_e0 = mVar17 + mVar5;
  local_d8 = (ulong)comment_size;
  if (local_e8 + local_d8 + local_e0 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  iVar6 = stat(pSrc_filename,(stat *)&state);
  if (iVar6 != 0) {
    return 0;
  }
  mz_zip_time_t_to_dos_time(local_70,&dos_time,&dos_date);
  __stream = fopen(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko(__stream,0,2);
  ptVar8 = (tdefl_compressor *)ftello(__stream);
  fseeko(__stream,0,0);
  if ((ulong)ptVar8 >> 0x20 != 0) {
    fclose(__stream);
    return 0;
  }
  uVar16 = uVar16 & 0xf;
  if (ptVar8 < (tdefl_compressor *)0x4) {
    uVar16 = 0;
  }
  lVar14 = (ulong)mVar5 + 0x1e;
  local_f8 = ptVar8;
  mVar4 = mz_zip_writer_write_zeros(pZip,mVar17,(mz_uint32)lVar14);
  sVar2 = local_e8;
  if (mVar4 == 0) goto LAB_003a2215;
  if ((pZip->m_file_offset_alignment != 0) && ((local_e0 & pZip->m_file_offset_alignment - 1) != 0))
  {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                  ,0x18d6,
                  "mz_bool mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint, mz_uint32)"
                 );
  }
  mVar17 = lVar14 + mVar17;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar17,pArchive_name,local_e8);
  if (sVar9 != sVar2) goto LAB_003a2215;
  mVar17 = mVar17 + sVar2;
  if (local_f8 == (tdefl_compressor *)0x0) {
    ptVar8 = (tdefl_compressor *)0x0;
    local_100 = (tdefl_compressor *)0x0;
    local_118 = 0;
    goto LAB_003a2305;
  }
  pmVar10 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
  local_f0 = pmVar10;
  if (pmVar10 == (mz_uint8 *)0x0) goto LAB_003a2215;
  if (uVar16 != 0) {
    local_100 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_100 != (tdefl_compressor *)0x0) {
      state.m_comp_size = 0;
      local_118 = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar17;
      mVar5 = tdefl_create_comp_flags_from_zip_params(uVar16,-0xf,0);
      tdefl_init(local_100,mz_zip_writer_add_put_buf_callback,&state,mVar5);
      pmVar10 = local_f0;
      ptVar8 = local_f8;
      do {
        ptVar13 = (tdefl_compressor *)0x10000;
        if (ptVar8 < (tdefl_compressor *)0x10000) {
          ptVar13 = ptVar8;
        }
        ptVar11 = (tdefl_compressor *)fread(pmVar10,1,(size_t)ptVar13,__stream);
        bVar18 = ptVar11 != ptVar13;
        if (bVar18) goto LAB_003a21ed;
        local_118 = mz_crc32(local_118 & 0xffffffff,pmVar10,(size_t)ptVar13);
        ptVar8 = (tdefl_compressor *)((long)ptVar8 - (long)ptVar13);
        tVar7 = tdefl_compress_buffer
                          (local_100,pmVar10,(size_t)ptVar13,
                           (uint)(ptVar8 == (tdefl_compressor *)0x0) << 2);
      } while (tVar7 == TDEFL_STATUS_OKAY);
      if (tVar7 != TDEFL_STATUS_DONE) {
        bVar18 = true;
      }
LAB_003a21ed:
      uVar12 = (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
      if (!bVar18) {
        local_100 = (tdefl_compressor *)CONCAT62((int6)((ulong)uVar12 >> 0x10),8);
        ptVar8 = (tdefl_compressor *)state.m_comp_size;
        mVar17 = state.m_cur_archive_file_ofs;
        goto LAB_003a22f4;
      }
    }
    pvVar15 = pZip->m_pAlloc_opaque;
    pmVar10 = local_f0;
LAB_003a22c4:
    (*pZip->m_pFree)(pvVar15,pmVar10);
LAB_003a2215:
    fclose(__stream);
    return 0;
  }
  local_118 = 0;
  for (local_100 = local_f8; local_100 != (tdefl_compressor *)0x0;
      local_100 = (tdefl_compressor *)((long)local_100 - (long)ptVar8)) {
    ptVar8 = (tdefl_compressor *)0x10000;
    if (local_100 < (tdefl_compressor *)0x10000) {
      ptVar8 = local_100;
    }
    ptVar13 = (tdefl_compressor *)fread(pmVar10,1,(size_t)ptVar8,__stream);
    if ((ptVar13 != ptVar8) ||
       (ptVar13 = (tdefl_compressor *)
                  (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar17,pmVar10,(size_t)ptVar8),
       ptVar13 != ptVar8)) {
      pvVar15 = pZip->m_pAlloc_opaque;
      goto LAB_003a22c4;
    }
    local_118 = mz_crc32(local_118 & 0xffffffff,pmVar10,(size_t)ptVar8);
    mVar17 = (long)ptVar8->m_max_probes + (mVar17 - 0x14);
  }
  local_100 = (tdefl_compressor *)0x0;
  ptVar8 = local_f8;
LAB_003a22f4:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f0);
LAB_003a2305:
  fclose(__stream);
  mVar1 = dos_time;
  method = dos_date;
  if ((ulong)ptVar8 >> 0x20 != 0) {
    return 0;
  }
  if (mVar17 >> 0x20 != 0) {
    return 0;
  }
  uVar3 = 0x14;
  if ((short)local_100 == 0) {
    uVar3 = 0;
  }
  state.m_pZip = (mz_zip_archive *)CONCAT35(0,CONCAT14(uVar3,0x4034b50));
  state.m_cur_archive_file_ofs =
       CONCAT17((char)(local_118 >> 8),
                CONCAT16((char)local_118,
                         CONCAT15((char)(dos_date >> 8),
                                  CONCAT14((char)dos_date,
                                           CONCAT13((char)(dos_time >> 8),
                                                    CONCAT12((char)dos_time,
                                                             CONCAT11(0,(byte)local_100)))))));
  state.m_comp_size =
       CONCAT17((char)((ulong)local_f8 >> 8),
                CONCAT16((char)local_f8,
                         CONCAT15((char)((ulong)ptVar8 >> 0x18),
                                  CONCAT14((char)((ulong)ptVar8 >> 0x10),
                                           CONCAT13((char)((ulong)ptVar8 >> 8),
                                                    CONCAT12((char)ptVar8,(short)(local_118 >> 0x10)
                                                            ))))));
  dos_date_00 = 0x23ea;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_e0,&state,0x1e);
  if (sVar9 != 0x1e) {
    return 0;
  }
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_e8,local_d0,(mz_uint16)local_d8,local_f8,
                     (mz_uint16)ptVar8,local_118,(ulong)local_100 & 0xffff,(uint)mVar1,method,
                     (mz_uint16)local_e0,(mz_uint16)ext_attributes,dos_date_00,
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
  if (mVar4 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar17;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  time_t file_modified_time;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs, uncomp_size = 0,
                                                        comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  local_dir_header_ofs = cur_archive_file_ofs = pZip->m_archive_size;

  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  memset(&file_modified_time, 0, sizeof(file_modified_time));
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return MZ_FALSE;
  mz_zip_time_t_to_dos_time(file_modified_time, &dos_time, &dos_date);

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}